

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O1

bool __thiscall DelayImpFuncWrapper::isByOrdinal(DelayImpFuncWrapper *this)

{
  bool isOk;
  
  (*(this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
            (this,0,0xffffffffffffffff);
  return false;
}

Assistant:

bool DelayImpFuncWrapper::isByOrdinal()
{
    bool isOk = false;
    uint64_t addr = this->getNumValue(NAMETHUNK_ADDR, &isOk);
    if (!isOk || addr == INVALID_ADDR) return false;

    if (isBit64()) {
        if (addr & ORDINAL_FLAG64) return true;

    } else {
        if (addr & ORDINAL_FLAG32) return true;
    }
    return false;
}